

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O2

tbx_t * tbx_index(BGZF *fp,int min_shift,tbx_conf_t *conf)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  tbx_t *tbx;
  hts_idx_t *phVar5;
  kh_s2i_t *pkVar6;
  bool bVar7;
  uint64_t offset0;
  long lVar8;
  int local_90;
  int local_8c;
  int local_88;
  hts_idx_t *local_80;
  kstring_t local_78;
  tbx_intv_t intv;
  
  tbx = (tbx_t *)calloc(1,0x28);
  local_78.l = 0;
  local_78.m = 0;
  local_78.s = (char *)0x0;
  iVar1 = conf->line_skip;
  (tbx->conf).meta_char = conf->meta_char;
  (tbx->conf).line_skip = iVar1;
  iVar1 = conf->sc;
  iVar2 = conf->bc;
  iVar3 = conf->ec;
  (tbx->conf).preset = conf->preset;
  (tbx->conf).sc = iVar1;
  (tbx->conf).bc = iVar2;
  (tbx->conf).ec = iVar3;
  if (min_shift < 1) {
    local_90 = 2;
    local_8c = 5;
    local_88 = 0xe;
  }
  else {
    local_8c = (0x21 - min_shift) / 3;
    local_90 = 0;
    local_88 = min_shift;
  }
  bVar7 = true;
  local_80 = (hts_idx_t *)0x0;
  lVar8 = 0;
  offset0 = 0;
  do {
    while( true ) {
      iVar4 = bgzf_getline(fp,10,&local_78);
      if (iVar4 < 0) {
        if (local_80 == (hts_idx_t *)0x0) {
          local_80 = hts_idx_init(0,local_90,offset0,local_88,local_8c);
          tbx->idx = local_80;
        }
        if (tbx->dict == (void *)0x0) {
          pkVar6 = kh_init_s2i();
          tbx->dict = pkVar6;
        }
        hts_idx_finish(local_80,(ulong)(ushort)fp->block_offset | fp->block_address << 0x10);
        tbx_set_meta(tbx);
        free(local_78.s);
        return tbx;
      }
      if (((tbx->conf).line_skip <= lVar8) && ((tbx->conf).meta_char != (int)*local_78.s)) break;
      offset0 = (ulong)(ushort)fp->block_offset | fp->block_address << 0x10;
      lVar8 = lVar8 + 1;
    }
    if (bVar7) {
      phVar5 = hts_idx_init(0,local_90,offset0,local_88,local_8c);
      tbx->idx = phVar5;
    }
    lVar8 = lVar8 + 1;
    get_intv(tbx,&local_78,&intv,1);
    local_80 = tbx->idx;
    iVar4 = hts_idx_push(local_80,intv.tid,(int)intv.beg,(int)intv.end,
                         (ulong)(ushort)fp->block_offset | fp->block_address << 0x10,1);
    bVar7 = false;
  } while (-1 < iVar4);
  free(local_78.s);
  tbx_destroy(tbx);
  return (tbx_t *)0x0;
}

Assistant:

tbx_t *tbx_index(BGZF *fp, int min_shift, const tbx_conf_t *conf)
{
    tbx_t *tbx;
    kstring_t str;
    int ret, first = 0, n_lvls, fmt;
    int64_t lineno = 0;
    uint64_t last_off = 0;
    tbx_intv_t intv;

    str.s = 0; str.l = str.m = 0;
    tbx = (tbx_t*)calloc(1, sizeof(tbx_t));
    tbx->conf = *conf;
    if (min_shift > 0) n_lvls = (TBX_MAX_SHIFT - min_shift + 2) / 3, fmt = HTS_FMT_CSI;
    else min_shift = 14, n_lvls = 5, fmt = HTS_FMT_TBI;
    while ((ret = bgzf_getline(fp, '\n', &str)) >= 0) {
        ++lineno;
        if (lineno <= tbx->conf.line_skip || str.s[0] == tbx->conf.meta_char) {
            last_off = bgzf_tell(fp);
            continue;
        }
        if (first == 0) {
            tbx->idx = hts_idx_init(0, fmt, last_off, min_shift, n_lvls);
            first = 1;
        }
        get_intv(tbx, &str, &intv, 1);
        ret = hts_idx_push(tbx->idx, intv.tid, intv.beg, intv.end, bgzf_tell(fp), 1);
        if (ret < 0)
        {
            free(str.s);
            tbx_destroy(tbx);
            return NULL;
        }
    }
    if ( !tbx->idx ) tbx->idx = hts_idx_init(0, fmt, last_off, min_shift, n_lvls);   // empty file
    if ( !tbx->dict ) tbx->dict = kh_init(s2i);
    hts_idx_finish(tbx->idx, bgzf_tell(fp));
    tbx_set_meta(tbx);
    free(str.s);
    return tbx;
}